

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

LightLeSample * __thiscall
pbrt::ProjectionLight::SampleLe
          (LightLeSample *__return_storage_ptr__,ProjectionLight *this,Point2f *u1,Point2f *u2,
          SampledWavelengths *lambda,Float time)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  RGB *pRVar7;
  int c;
  int c_00;
  Float FVar8;
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  float n2;
  float fVar15;
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  Point3<float> PVar19;
  Vector3<float> VVar20;
  SampledSpectrum SVar21;
  Float pdf;
  RGB local_e8;
  Tuple2<pbrt::Vector2,_float> local_d8;
  ProjectionLight *local_c8;
  SampledWavelengths *local_c0;
  LightLeSample *local_b8;
  WrapMode2D local_b0;
  Point2f ps;
  int vb;
  undefined1 auStack_9c [12];
  Ray ray;
  Tuple3<pbrt::Vector3,_float> local_68;
  Float va;
  Float FStack_54;
  float local_50;
  Tuple3<pbrt::Vector3,_float> local_4c;
  Float local_40;
  MediumHandle local_38;
  undefined1 extraout_var [56];
  undefined1 auVar14 [56];
  undefined1 auVar18 [56];
  
  local_d8.x = time;
  auVar9._0_8_ = PiecewiseConstant2D::Sample(&this->distrib,u1,&pdf);
  auVar9._8_56_ = extraout_var;
  ps.super_Tuple2<pbrt::Point2,_float> = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar9._0_16_);
  if ((pdf != 0.0) || (NAN(pdf))) {
    ray.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar9._0_16_);
    ray.o.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
    auVar14 = extraout_var;
    local_c0 = lambda;
    local_b8 = __return_storage_ptr__;
    PVar19 = Transform::operator()(&this->LightFromScreen,&ray.o);
    local_68.z = PVar19.super_Tuple3<pbrt::Point3,_float>.z;
    auVar10._0_8_ = PVar19.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar10._8_56_ = auVar14;
    local_68._0_8_ = vmovlps_avx(auVar10._0_16_);
    VVar20 = Normalize<float>((Vector3<float> *)&local_68);
    local_4c.z = VVar20.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar11._0_8_ = VVar20.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar11._8_56_ = auVar14;
    local_38.
    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
    .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
             )(this->super_LightBase).mediumInterface.outside.
              super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
              .bits;
    c_00 = 0;
    va = 0.0;
    FStack_54 = 0.0;
    local_50 = 0.0;
    local_4c._0_8_ = vmovlps_avx(auVar11._0_16_);
    local_40 = local_d8.x;
    Transform::operator()(&ray,&(this->super_LightBase).renderFromLight,(Ray *)&va,(Float *)0x0);
    VVar20 = Normalize<float>((Vector3<float> *)&local_68);
    fVar15 = VVar20.super_Tuple3<pbrt::Vector3,_float>.z;
    va = fVar15;
    auVar6._12_4_ = 0;
    auVar6._0_12_ = auStack_9c;
    _vb = (array<float,_4>)(auVar6 << 0x20);
    if (fVar15 <= 0.0) {
      LogFatal<char_const(&)[9],char_const(&)[2],char_const(&)[9],float&,char_const(&)[2],int&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/lights.cpp"
                 ,0x173,"Check failed: %s > %s with %s = %s, %s = %s",(char (*) [9])"cosTheta",
                 (char (*) [2])0x2cf1ae5,(char (*) [9])"cosTheta",(float *)&va,
                 (char (*) [2])0x2cf1ae5,&vb);
    }
    fVar1 = (this->screenBounds).pMax.super_Tuple2<pbrt::Point2,_float>.y;
    fVar2 = (this->screenBounds).pMin.super_Tuple2<pbrt::Point2,_float>.y;
    fVar3 = (this->screenBounds).pMax.super_Tuple2<pbrt::Point2,_float>.x;
    fVar4 = (this->screenBounds).pMin.super_Tuple2<pbrt::Point2,_float>.x;
    fVar5 = this->A;
    local_d8 = (Tuple2<pbrt::Vector2,_float>)Bounds2<float>::Offset(&this->screenBounds,&ps);
    local_e8.r = 0.0;
    local_e8.g = 0.0;
    local_e8.b = 0.0;
    local_c8 = this;
    for (; c_00 != 3; c_00 = c_00 + 1) {
      WrapMode2D::WrapMode2D(&local_b0,Clamp);
      FVar8 = Image::LookupNearestChannel(&this->image,(Point2f)local_d8,c_00,local_b0);
      pRVar7 = &local_e8;
      if ((c_00 != 0) && (pRVar7 = (RGB *)&local_e8.g, c_00 != 1)) {
        pRVar7 = (RGB *)&local_e8.b;
      }
      pRVar7->r = FVar8;
    }
    auVar14 = ZEXT856(0);
    FVar8 = local_c8->scale;
    auVar18 = (undefined1  [56])0x0;
    local_d8.x = ((fVar3 - fVar4) * (fVar1 - fVar2) * pdf) / (fVar15 * fVar15 * fVar15 * fVar5);
    RGBSpectrum::RGBSpectrum((RGBSpectrum *)&va,local_c8->imageColorSpace,&local_e8);
    SVar21 = RGBSpectrum::Sample((RGBSpectrum *)&va,local_c0);
    auVar16._0_8_ = SVar21.values.values._8_8_;
    auVar16._8_56_ = auVar18;
    auVar12._0_8_ = SVar21.values.values._0_8_;
    auVar12._8_56_ = auVar14;
    _vb = (array<float,_4>)vmovlhps_avx(auVar12._0_16_,auVar16._0_16_);
    auVar14 = (undefined1  [56])0x0;
    SVar21 = SampledSpectrum::operator*((SampledSpectrum *)&vb,FVar8);
    auVar17._0_8_ = SVar21.values.values._8_8_;
    auVar17._8_56_ = auVar18;
    auVar13._0_8_ = SVar21.values.values._0_8_;
    auVar13._8_56_ = auVar14;
    auVar6 = vmovlhps_avx(auVar13._0_16_,auVar17._0_16_);
    *(undefined1 (*) [16])(local_b8->L).values.values = auVar6;
    (local_b8->ray).o.super_Tuple3<pbrt::Point3,_float>.x =
         ray.o.super_Tuple3<pbrt::Point3,_float>.x;
    (local_b8->ray).o.super_Tuple3<pbrt::Point3,_float>.y =
         ray.o.super_Tuple3<pbrt::Point3,_float>.y;
    *(ulong *)&(local_b8->ray).o.super_Tuple3<pbrt::Point3,_float>.z =
         CONCAT44(ray.d.super_Tuple3<pbrt::Vector3,_float>.x,
                  ray.o.super_Tuple3<pbrt::Point3,_float>.z);
    (local_b8->ray).d.super_Tuple3<pbrt::Vector3,_float>.x =
         ray.d.super_Tuple3<pbrt::Vector3,_float>.x;
    (local_b8->ray).d.super_Tuple3<pbrt::Vector3,_float>.y =
         ray.d.super_Tuple3<pbrt::Vector3,_float>.y;
    *(undefined8 *)&(local_b8->ray).d.super_Tuple3<pbrt::Vector3,_float>.z = ray._20_8_;
    (local_b8->ray).medium.
    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
    .bits = (uintptr_t)
            ray.medium.
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
            .bits;
    (local_b8->intr).set = false;
    local_b8->pdfPos = 1.0;
    local_b8->pdfDir = local_d8.x;
    __return_storage_ptr__ = local_b8;
  }
  else {
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x38) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x40) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x48) = 0;
    *(undefined8 *)&(__return_storage_ptr__->intr).set = 0;
    __return_storage_ptr__->pdfPos = 0.0;
    __return_storage_ptr__->pdfDir = 0.0;
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 8) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x10) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x18) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x38) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x40) = 0;
    (__return_storage_ptr__->L).values.values[0] = 0.0;
    (__return_storage_ptr__->L).values.values[1] = 0.0;
    (__return_storage_ptr__->L).values.values[2] = 0.0;
    (__return_storage_ptr__->L).values.values[3] = 0.0;
    (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
    (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.y = 0.0;
    *(undefined8 *)&(__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.z = 0;
    (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
    (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
    *(undefined8 *)&(__return_storage_ptr__->ray).time = 0;
    (__return_storage_ptr__->ray).medium.
    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
    .bits = 0;
    (__return_storage_ptr__->intr).optionalValue.__align = (anon_struct_8_0_00000001_for___align)0x0
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

LightLeSample ProjectionLight::SampleLe(const Point2f &u1, const Point2f &u2,
                                        SampledWavelengths &lambda, Float time) const {
    Float pdf;
    Point2f ps = distrib.Sample(u1, &pdf);
    if (pdf == 0)
        return {};

    Vector3f w = Vector3f(LightFromScreen(Point3f(ps.x, ps.y, 0)));

    Ray ray = renderFromLight(
        Ray(Point3f(0, 0, 0), Normalize(w), time, mediumInterface.outside));
    Float cosTheta = CosTheta(Normalize(w));
    CHECK_GT(cosTheta, 0);
    Float pdfDir = pdf * screenBounds.Area() / (A * Pow<3>(cosTheta));

    Point2f p = Point2f(screenBounds.Offset(ps));
    RGB rgb;
    for (int c = 0; c < 3; ++c)
        rgb[c] = image.LookupNearestChannel(p, c);

    SampledSpectrum L = scale * RGBSpectrum(*imageColorSpace, rgb).Sample(lambda);

    return LightLeSample(L, ray, 1, pdfDir);
}